

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O0

sunrealtype N_VMinQuotientLocal_ManyVector(N_Vector num,N_Vector denom)

{
  long *in_RSI;
  long *in_RDI;
  sunrealtype lmin;
  sunrealtype min;
  sunindextype i;
  SUNContext_conflict sunctx_local_scope_;
  double local_40;
  double local_38;
  double local_28;
  long local_20;
  
  local_28 = 1.79769313486232e+308;
  for (local_20 = 0; local_20 < *(long *)*in_RDI; local_20 = local_20 + 1) {
    if (*(long *)(*(long *)(*(long *)(*(long *)(*in_RDI + 0x10) + local_20 * 8) + 8) + 0x170) == 0)
    {
      local_40 = (double)N_VMinQuotient(*(undefined8 *)(*(long *)(*in_RDI + 0x10) + local_20 * 8),
                                        *(undefined8 *)(*(long *)(*in_RSI + 0x10) + local_20 * 8));
      if (local_28 < local_40) {
        local_40 = local_28;
      }
      local_28 = local_40;
    }
    else {
      local_38 = (double)N_VMinQuotientLocal(*(undefined8 *)
                                              (*(long *)(*in_RDI + 0x10) + local_20 * 8),
                                             *(undefined8 *)
                                              (*(long *)(*in_RSI + 0x10) + local_20 * 8));
      if (local_28 < local_38) {
        local_38 = local_28;
      }
      local_28 = local_38;
    }
  }
  return local_28;
}

Assistant:

sunrealtype MVAPPEND(N_VMinQuotientLocal)(N_Vector num, N_Vector denom)
{
  SUNFunctionBegin(num->sunctx);
  sunindextype i;
  sunrealtype min, lmin;

  /* initialize output*/
  min = SUN_BIG_REAL;

  for (i = 0; i < MANYVECTOR_NUM_SUBVECS(num); i++)
  {
    /* check for nvminquotientlocal in subvector */
    if (MANYVECTOR_SUBVEC(num, i)->ops->nvminquotientlocal)
    {
      lmin = N_VMinQuotientLocal(MANYVECTOR_SUBVEC(num, i),
                                 MANYVECTOR_SUBVEC(denom, i));
      SUNCheckLastErrNoRet();
      min = (min < lmin) ? min : lmin;

      /* otherwise, call nvmin and accumulate to overall min */
    }
    else
    {
      lmin = N_VMinQuotient(MANYVECTOR_SUBVEC(num, i),
                            MANYVECTOR_SUBVEC(denom, i));
      SUNCheckLastErrNoRet();
      min = (min < lmin) ? min : lmin;
    }
  }

  return (min);
}